

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyProcess.cpp
# Opt level: O0

void __thiscall MyProcess::~MyProcess(MyProcess *this)

{
  MyProcess *this_local;
  
  if (this->in != (Handler *)0x0) {
    (*this->in->_vptr_Handler[4])();
  }
  if (this->out != (Handler *)0x0) {
    (*this->out->_vptr_Handler[4])();
  }
  MyProcessEnvironment::~MyProcessEnvironment(&this->env);
  std::__cxx11::string::~string((string *)&this->arguments);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

MyProcess::~MyProcess() {
#ifdef _WIN32
    CloseHandle( pid.hProcess);
    CloseHandle( pid.hThread);
#elif defined(__linux__) || defined(__APPLE__)
    delete in;
    delete out;
#endif
}